

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall
wasm::WasmBinaryBuilder::getResizableLimits
          (WasmBinaryBuilder *this,Address *initial,Address *max,bool *shared,Type *indexType,
          Address defaultIfNoMax)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  string local_68;
  Address *local_48;
  Type *local_40;
  allocator<char> local_31;
  
  local_48 = max;
  local_40 = indexType;
  uVar1 = getU32LEB(this);
  if ((uVar1 & 4) == 0) {
    uVar2 = getU32LEB(this);
    uVar3 = (ulong)uVar2;
  }
  else {
    uVar3 = getU64LEB(this);
  }
  initial->addr = uVar3;
  if ((uVar1 & 3) != 2) {
    *shared = (bool)((byte)uVar1 >> 1 & 1);
    local_40->id = 3 - (ulong)((uVar1 & 4) == 0);
    if ((uVar1 & 1) != 0) {
      if ((uVar1 & 4) == 0) {
        uVar1 = getU32LEB(this);
        defaultIfNoMax.addr = (address64_t)uVar1;
      }
      else {
        defaultIfNoMax.addr = getU64LEB(this);
      }
    }
    local_48->addr = defaultIfNoMax.addr;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"shared memory must have max size",&local_31);
  throwError(this,&local_68);
}

Assistant:

void WasmBinaryBuilder::getResizableLimits(Address& initial,
                                           Address& max,
                                           bool& shared,
                                           Type& indexType,
                                           Address defaultIfNoMax) {
  auto flags = getU32LEB();
  bool hasMax = (flags & BinaryConsts::HasMaximum) != 0;
  bool isShared = (flags & BinaryConsts::IsShared) != 0;
  bool is64 = (flags & BinaryConsts::Is64) != 0;
  initial = is64 ? getU64LEB() : getU32LEB();
  if (isShared && !hasMax) {
    throwError("shared memory must have max size");
  }
  shared = isShared;
  indexType = is64 ? Type::i64 : Type::i32;
  if (hasMax) {
    max = is64 ? getU64LEB() : getU32LEB();
  } else {
    max = defaultIfNoMax;
  }
}